

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

void map_put(Map *map,void *key,void *value)

{
  undefined8 *puVar1;
  uint uVar2;
  List *pLVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  Elem *data;
  ListNode *local_40;
  ListNode *node;
  Elem *elem;
  List *els;
  uint pos;
  void *value_local;
  void *key_local;
  Map *map_local;
  
  uVar2 = hash_fun(key,map->prime);
  if (map->elem[uVar2] == (void *)0x0) {
    pLVar3 = new_list();
    map->elem[uVar2] = pLVar3;
  }
  pLVar3 = map_get_(map,key);
  local_40 = pLVar3->head;
  while( true ) {
    if (local_40 == (ListNode *)0x0) {
      data = new_elem(key,value);
      list_add(pLVar3,data);
      map->size = map->size + 1;
      return;
    }
    puVar1 = (undefined8 *)local_40->data;
    uVar4 = hash(key);
    uVar5 = hash((void *)*puVar1);
    if (uVar4 == uVar5) break;
    local_40 = local_40->next;
  }
  puVar1[1] = value;
  return;
}

Assistant:

void map_put(Map *map, void *key, void *value) {
    uint pos = hash_fun(key, map->prime);
    if (map->elem[pos] == NULL) {
        map->elem[pos] = new_list();
    }
    List *els = map_get_(map, key);
    Elem *elem;
    ListNode *node = els->head;
    while (node != NULL) {
        elem = node->data;
        if (hash(key) == hash(elem->key)) {
            elem->value = value;
            return;
        }
        node = node->next;
    }
    list_add(els, new_elem(key, value));
    map->size++;
}